

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O1

void __thiscall
dxil_spv::CFGStructurizer::rewrite_transposed_loop_inner
          (CFGStructurizer *this,CFGNode *node,CFGNode *impossible_merge_target,
          LoopMergeAnalysis *analysis)

{
  CFGNode *pCVar1;
  CFGNode *to;
  pointer pcVar2;
  CFGNode *to_00;
  CFGNode *this_00;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
  *paVar4;
  pointer ppCVar5;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> __str;
  String local_88;
  Vector<CFGNode_*> ladder_preds;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_50;
  
  pCVar1 = analysis->merge;
  to = analysis->dominated_merge;
  to_00 = CFGNodePool::create_node(this->pool);
  pcVar2 = (node->name)._M_dataplus._M_p;
  __str._M_dataplus._M_p = (pointer)&__str.field_2;
  std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>::
  _M_construct<char*>((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>
                       *)&__str,pcVar2,pcVar2 + (node->name)._M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  append(&__str,".transposed-merge-inner.break");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  operator=(&to_00->name,&__str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
       *)__str._M_dataplus._M_p != &__str.field_2) {
    free_in_thread(__str._M_dataplus._M_p);
  }
  (to_00->ir).terminator.type = Branch;
  (to_00->ir).terminator.direct_block = impossible_merge_target;
  to_00->immediate_post_dominator = impossible_merge_target;
  to_00->forward_post_visit_order = impossible_merge_target->forward_post_visit_order;
  to_00->backward_post_visit_order = impossible_merge_target->backward_post_visit_order;
  this_00 = CFGNodePool::create_node(this->pool);
  __str._M_dataplus._M_p = (pointer)&__str.field_2;
  pcVar2 = (node->name)._M_dataplus._M_p;
  std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>::
  _M_construct<char*>((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>
                       *)&__str,pcVar2,pcVar2 + (node->name)._M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  append(&__str,".transposed-merge-inner");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  operator=(&this_00->name,&__str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
       *)__str._M_dataplus._M_p != &__str.field_2) {
    free_in_thread(__str._M_dataplus._M_p);
  }
  this_00->forward_post_visit_order = impossible_merge_target->forward_post_visit_order;
  this_00->backward_post_visit_order = impossible_merge_target->backward_post_visit_order;
  this_00->immediate_post_dominator = pCVar1;
  to_00->immediate_dominator = this_00;
  std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::vector
            (&ladder_preds,&to->pred);
  CFGNode::add_branch(this_00,to_00);
  CFGNode::add_branch(this_00,to);
  traverse_dominated_blocks_and_rewrite_branch(this,node,impossible_merge_target,this_00);
  CFGNode::recompute_immediate_dominator(this_00);
  CFGNode::add_branch(to_00,impossible_merge_target);
  for (ppCVar5 = ladder_preds.
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppCVar5 !=
      ladder_preds.
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppCVar5 = ppCVar5 + 1) {
    CFGNode::retarget_branch(*ppCVar5,to,this_00);
  }
  __str._M_string_length = 0;
  __str._M_dataplus._M_p = (pointer)&ladder_preds;
  __str.field_2._8_8_ =
       std::
       _Function_handler<bool_(const_dxil_spv::CFGNode_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp:5472:3)>
       ::_M_invoke;
  __str.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<bool_(const_dxil_spv::CFGNode_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp:5472:3)>
       ::_M_manager;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>> *)
             &local_50,"transposed_selector_","");
  pbVar3 = std::__cxx11::
           basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
           _M_append(&local_50,(node->name)._M_dataplus._M_p,(node->name)._M_string_length);
  local_88._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
       *)local_88._M_dataplus._M_p == paVar4) {
    local_88.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_88.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  }
  else {
    local_88.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  local_88._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  rewrite_ladder_conditional_branch_from_incoming_blocks
            (this,this_00,to,to_00,(function<bool_(const_dxil_spv::CFGNode_*)> *)&__str,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    free_in_thread(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    free_in_thread(local_50._M_dataplus._M_p);
  }
  if (__str.field_2._M_allocated_capacity != 0) {
    (*(code *)__str.field_2._M_allocated_capacity)(&__str,&__str,3);
  }
  if (ladder_preds.
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free_in_thread(ladder_preds.
                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void CFGStructurizer::rewrite_transposed_loop_inner(CFGNode *node, CFGNode *impossible_merge_target,
                                                    const LoopMergeAnalysis &analysis)
{
	// Rewrite the control flow from the inside out through a transposition.
	// The common break target will become the merge block instead.
	// The continue will break out to the transposed merge instead.
	// In the ladder, we will enter a breaking path which branches out to loop_ladder.

	// We just arbitrary call this "inner", since I don't think it has a formal name.
	// In this case, dominated merge cannot reach impossible merge target.

	auto *merge = analysis.merge;
	auto *dominated_merge = analysis.dominated_merge;

	auto *ladder_break = pool.create_node();
	ladder_break->name = node->name + ".transposed-merge-inner.break";
	ladder_break->ir.terminator.type = Terminator::Type::Branch;
	ladder_break->ir.terminator.direct_block = impossible_merge_target;
	ladder_break->immediate_post_dominator = impossible_merge_target;
	ladder_break->forward_post_visit_order = impossible_merge_target->forward_post_visit_order;
	ladder_break->backward_post_visit_order = impossible_merge_target->backward_post_visit_order;

	auto *ladder_selection = pool.create_node();
	ladder_selection->name = node->name + ".transposed-merge-inner";
	ladder_selection->forward_post_visit_order = impossible_merge_target->forward_post_visit_order;
	ladder_selection->backward_post_visit_order = impossible_merge_target->backward_post_visit_order;
	ladder_selection->immediate_post_dominator = merge;
	ladder_break->immediate_dominator = ladder_selection;

	auto ladder_preds = dominated_merge->pred;

	ladder_selection->add_branch(ladder_break);
	ladder_selection->add_branch(dominated_merge);
	traverse_dominated_blocks_and_rewrite_branch(node, impossible_merge_target, ladder_selection);
	ladder_selection->recompute_immediate_dominator();

	ladder_break->add_branch(impossible_merge_target);

	// Branches from these blocks should be rewritten to target transposed-merge.
	for (auto *ladder_pred : ladder_preds)
		ladder_pred->retarget_branch(dominated_merge, ladder_selection);

	rewrite_ladder_conditional_branch_from_incoming_blocks(
		ladder_selection,
		dominated_merge, ladder_break,
		[&](const CFGNode *n) { return std::find(ladder_preds.begin(), ladder_preds.end(), n) != ladder_preds.end(); },
		String("transposed_selector_") + node->name);
}